

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef
BinaryenStructSet(BinaryenModuleRef module,BinaryenIndex index,BinaryenExpressionRef ref,
                 BinaryenExpressionRef value)

{
  StructSet *this;
  
  this = (StructSet *)MixedArena::allocSpace(&module->allocator,0x30,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)67>).super_Expression._id = StructSetId;
  (this->super_SpecificExpression<(wasm::Expression::Id)67>).super_Expression.type.id = 0;
  this->index = index;
  this->ref = ref;
  this->value = value;
  this->order = Unordered;
  wasm::StructSet::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenStructSet(BinaryenModuleRef module,
                                        BinaryenIndex index,
                                        BinaryenExpressionRef ref,
                                        BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeStructSet(
        index, (Expression*)ref, (Expression*)value, MemoryOrder::Unordered));
}